

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O0

void print_capabilities_and_extensions(Compiler *compiler)

{
  FILE *__stream;
  SmallVector<spv::Capability,_8UL> *this;
  Capability *pCVar1;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar2;
  undefined8 uVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *ext;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__end1_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__begin1_1;
  SmallVector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_8UL>
  *__range1_1;
  Capability *capability;
  Capability *__end1;
  Capability *__begin1;
  SmallVector<spv::Capability,_8UL> *__range1;
  Compiler *compiler_local;
  
  fprintf(_stderr,"Capabilities\n");
  fprintf(_stderr,"============\n");
  this = spirv_cross::Compiler::get_declared_capabilities(compiler);
  __end1 = spirv_cross::VectorView<spv::Capability>::begin(&this->super_VectorView<spv::Capability>)
  ;
  pCVar1 = spirv_cross::VectorView<spv::Capability>::end(&this->super_VectorView<spv::Capability>);
  for (; __end1 != pCVar1; __end1 = __end1 + 1) {
    fprintf(_stderr,"Capability: %u\n",(ulong)*__end1);
  }
  fprintf(_stderr,"============\n\n");
  fprintf(_stderr,"Extensions\n");
  fprintf(_stderr,"============\n");
  this_00 = spirv_cross::Compiler::get_declared_extensions_abi_cxx11_(compiler);
  __end1_1 = spirv_cross::
             VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
             ::begin(&this_00->
                      super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    );
  pbVar2 = spirv_cross::
           VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           ::end(&this_00->
                  super_VectorView<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                );
  for (; __stream = _stderr, __end1_1 != pbVar2; __end1_1 = __end1_1 + 0x20) {
    uVar3 = std::__cxx11::string::c_str();
    fprintf(__stream,"Extension: %s\n",uVar3);
  }
  fprintf(_stderr,"============\n\n");
  return;
}

Assistant:

static void print_capabilities_and_extensions(const Compiler &compiler)
{
	fprintf(stderr, "Capabilities\n");
	fprintf(stderr, "============\n");
	for (auto &capability : compiler.get_declared_capabilities())
		fprintf(stderr, "Capability: %u\n", static_cast<unsigned>(capability));
	fprintf(stderr, "============\n\n");

	fprintf(stderr, "Extensions\n");
	fprintf(stderr, "============\n");
	for (auto &ext : compiler.get_declared_extensions())
		fprintf(stderr, "Extension: %s\n", ext.c_str());
	fprintf(stderr, "============\n\n");
}